

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketCompression.cpp
# Opt level: O1

void __thiscall
tonk::MessageDecompressor::InsertUncompressed(MessageDecompressor *this,uint8_t *data,uint bytes)

{
  uint *puVar1;
  uint8_t *__dest;
  
  if (bytes <= this->MaxCompressedMessagesBytes) {
    if (24000 < this->MaxCompressedMessagesBytes + (this->History).NextWriteOffset) {
      (this->History).NextWriteOffset = 0;
    }
    __dest = (this->History).Buffer + (this->History).NextWriteOffset;
    memcpy(__dest,data,(ulong)bytes);
    ZSTD_insertBlock(this->DCtx,__dest,(ulong)bytes);
    puVar1 = &(this->History).NextWriteOffset;
    *puVar1 = *puVar1 + bytes;
  }
  return;
}

Assistant:

void MessageDecompressor::InsertUncompressed(
    const uint8_t* data,
    unsigned bytes)
{
    if (bytes > MaxCompressedMessagesBytes) {
        TONK_DEBUG_BREAK(); // Invalid input
        return;
    }

    void* history = History.Allocate(MaxCompressedMessagesBytes);
    memcpy(history, data, bytes);
    ZSTD_insertBlock(DCtx, history, bytes);
    History.Commit(bytes);
}